

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void utf8_suite::test_FF_BF_BF_BF_BF_BF(void)

{
  char input [9];
  decoder_type decoder;
  undefined4 local_184;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  value_type local_160 [16];
  basic_decoder<char> local_150;
  
  local_160[0] = '\"';
  local_160[1] = -1;
  local_160[2] = -0x41;
  local_160[3] = -0x41;
  local_160[4] = -0x41;
  local_160[5] = -0x41;
  local_160[6] = -0x41;
  local_160[7] = '\"';
  local_160[8] = '\0';
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<9ul>
            (&local_150,(value_type (*) [9])local_160);
  local_180._M_dataplus._M_p._0_4_ = local_150.current.code;
  local_184 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x8a0,"void utf8_suite::test_FF_BF_BF_BF_BF_BF()",&local_180,&local_184);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_180,&local_150);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[7]>
            ("decoder.string_value<std::string>()","\"\\xFF\\xBF\\xBF\\xBF\\xBF\\xBF\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x8a1,"void utf8_suite::test_FF_BF_BF_BF_BF_BF()",&local_180,anon_var_dwarf_6d5c);
  std::__cxx11::string::~string((string *)&local_180);
  return;
}

Assistant:

void test_FF_BF_BF_BF_BF_BF()
{
    const char input[] = "\"\xFF\xBF\xBF\xBF\xBF\xBF\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "\xFF\xBF\xBF\xBF\xBF\xBF");
}